

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<Blob<160>,block32>
               (block32 *key,int len,int maxlen,block32 *blocks,int blockcount,pfHash hash,
               vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  block32 *pbVar5;
  long lVar6;
  Blob<160> h;
  undefined1 local_48 [16];
  uint8_t local_38 [8];
  
  if (0 < blockcount && len != maxlen) {
    lVar6 = 0;
    pbVar5 = key + len;
    do {
      pcVar1 = blocks->c + lVar6;
      uVar2 = *(undefined8 *)(pcVar1 + 8);
      uVar3 = *(undefined8 *)(pcVar1 + 0x10);
      uVar4 = *(undefined8 *)(pcVar1 + 0x18);
      *(undefined8 *)pbVar5->c = *(undefined8 *)pcVar1;
      *(undefined8 *)(pbVar5->c + 8) = uVar2;
      *(undefined8 *)(pbVar5->c + 0x10) = uVar3;
      *(undefined8 *)(pbVar5->c + 0x18) = uVar4;
      local_48 = ZEXT816(0) << 0x20;
      local_38[0] = '\0';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      (*hash)(key,(len + 1) * 0x20,0,(value_type *)local_48);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,(value_type *)local_48);
      CombinationKeygenRecurse<Blob<160>,block32>(key,len + 1,maxlen,blocks,blockcount,hash,hashes);
      lVar6 = lVar6 + 0x20;
    } while ((ulong)(uint)blockcount << 5 != lVar6);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}